

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amount_tests.cpp
# Opt level: O3

void __thiscall amount_tests::MoneyRangeTest::test_method(MoneyRangeTest *this)

{
  iterator in_R8;
  iterator pvVar1;
  iterator in_R9;
  iterator pvVar2;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  undefined1 *local_178;
  undefined1 *local_170;
  char *local_168;
  char *local_160;
  undefined1 *local_158;
  undefined1 *local_150;
  char *local_148;
  char *local_140;
  undefined1 *local_138;
  undefined1 *local_130;
  char *local_128;
  char *local_120;
  undefined1 *local_118;
  undefined1 *local_110;
  char *local_108;
  char *local_100;
  undefined1 local_f2;
  undefined1 local_f1;
  lazy_ostream local_f0;
  undefined1 *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined **local_a8;
  undefined1 local_a0;
  undefined1 *local_98;
  undefined1 **local_90;
  undefined1 *local_88;
  undefined **local_80;
  undefined1 local_78;
  undefined1 *local_70;
  undefined1 **local_68;
  char *local_60;
  char *local_58;
  assertion_result local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/amount_tests.cpp"
  ;
  local_b8 = "";
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x10;
  file.m_begin = (iterator)&local_c0;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_d0,msg);
  local_f0.m_empty = false;
  local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_88 = &local_f1;
  local_f1 = 0;
  local_b0 = &local_f2;
  local_f2 = 0;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/amount_tests.cpp"
  ;
  local_58 = "";
  local_68 = &local_88;
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_01389268;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_a0 = 0;
  local_90 = &local_b0;
  local_a8 = &PTR__lazy_ostream_01389268;
  local_98 = boost::unit_test::lazy_ostream::inst;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_f0,1,2,REQUIRE,0xe3397f,(size_t)&local_60,0x10,&local_80,"false",
             &local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_108 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/amount_tests.cpp"
  ;
  local_100 = "";
  local_118 = &boost::unit_test::basic_cstring<char_const>::null;
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x11;
  file_00.m_begin = (iterator)&local_108;
  msg_00.m_end = pvVar2;
  msg_00.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_118,
             msg_00);
  local_f0.m_empty = false;
  local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_f1 = 1;
  local_f2 = 1;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/amount_tests.cpp"
  ;
  local_58 = "";
  local_88 = &local_f1;
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_01389268;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_f2;
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_01389268;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_f0,1,2,REQUIRE,0xe33997,(size_t)&local_60,0x11,&local_80,"true",
             &local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_128 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/amount_tests.cpp"
  ;
  local_120 = "";
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x12;
  file_01.m_begin = (iterator)&local_128;
  msg_01.m_end = pvVar2;
  msg_01.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_138,
             msg_01);
  local_f0.m_empty = false;
  local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_f1 = 1;
  local_f2 = 1;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/amount_tests.cpp"
  ;
  local_58 = "";
  local_88 = &local_f1;
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_01389268;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_f2;
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_01389268;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_f0,1,2,REQUIRE,0xe339ae,(size_t)&local_60,0x12,&local_80,"true",
             &local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_148 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/amount_tests.cpp"
  ;
  local_140 = "";
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x13;
  file_02.m_begin = (iterator)&local_148;
  msg_02.m_end = pvVar2;
  msg_02.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_158,
             msg_02);
  local_f0.m_empty = false;
  local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_f1 = 1;
  local_f2 = 1;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/amount_tests.cpp"
  ;
  local_58 = "";
  local_88 = &local_f1;
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_01389268;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_f2;
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_01389268;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_f0,1,2,REQUIRE,0xe339c5,(size_t)&local_60,0x13,&local_80,"true",
             &local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_168 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/amount_tests.cpp"
  ;
  local_160 = "";
  local_178 = &boost::unit_test::basic_cstring<char_const>::null;
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x14;
  file_03.m_begin = (iterator)&local_168;
  msg_03.m_end = pvVar2;
  msg_03.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_178,
             msg_03);
  local_f0.m_empty = false;
  local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_f1 = 0;
  local_f2 = 0;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/amount_tests.cpp"
  ;
  local_58 = "";
  local_88 = &local_f1;
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_01389268;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_f2;
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_01389268;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_f0,1,2,REQUIRE,0xe339db,(size_t)&local_60,0x14,&local_80,"false",
             &local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(MoneyRangeTest)
{
    BOOST_CHECK_EQUAL(MoneyRange(CAmount(-1)), false);
    BOOST_CHECK_EQUAL(MoneyRange(CAmount(0)), true);
    BOOST_CHECK_EQUAL(MoneyRange(CAmount(1)), true);
    BOOST_CHECK_EQUAL(MoneyRange(MAX_MONEY), true);
    BOOST_CHECK_EQUAL(MoneyRange(MAX_MONEY + CAmount(1)), false);
}